

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth2-server.c
# Opt level: O3

PacketProtocolLayer *
ssh2_userauth_server_new
          (PacketProtocolLayer *successor_layer,AuthPolicy *authpolicy,SshServerConfig *ssc)

{
  void *__s;
  
  __s = safemalloc(1,0xe8,0);
  memset(__s,0,0xe8);
  *(PacketProtocolLayerVtable **)((long)__s + 0x80) = &ssh2_userauth_server_vtable;
  *(PacketProtocolLayer **)((long)__s + 0x10) = successor_layer;
  *(AuthPolicy **)((long)__s + 0x28) = authpolicy;
  *(SshServerConfig **)((long)__s + 0x30) = ssc;
  return (PacketProtocolLayer *)((long)__s + 0x80);
}

Assistant:

PacketProtocolLayer *ssh2_userauth_server_new(
    PacketProtocolLayer *successor_layer, AuthPolicy *authpolicy,
    const SshServerConfig *ssc)
{
    struct ssh2_userauth_server_state *s =
        snew(struct ssh2_userauth_server_state);
    memset(s, 0, sizeof(*s));
    s->ppl.vt = &ssh2_userauth_server_vtable;

    s->successor_layer = successor_layer;
    s->authpolicy = authpolicy;
    s->ssc = ssc;

    return &s->ppl;
}